

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O1

void Ppmd7_Construct(CPpmd7 *p)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  long lVar11;
  
  p->Base = (Byte *)0x0;
  uVar3 = 0;
  uVar6 = 0;
  do {
    iVar7 = ((uint)(uVar3 >> 2) & 0x3fffffff) + 1;
    if (0xb < uVar3) {
      iVar7 = 4;
    }
    iVar8 = 0;
    uVar5 = uVar6;
    do {
      uVar9 = (ulong)uVar5;
      uVar5 = uVar5 + 1;
      p->Units2Indx[uVar9] = (Byte)uVar3;
      iVar8 = iVar8 + -1;
    } while (-iVar7 != iVar8);
    p->Indx2Units[uVar3] = (char)uVar6 - (char)iVar8;
    uVar3 = uVar3 + 1;
    uVar6 = uVar5;
  } while (uVar3 != 0x26);
  p->NS2BSIndx[0] = '\0';
  p->NS2BSIndx[1] = '\x02';
  p->NS2BSIndx[2] = '\x04';
  p->NS2BSIndx[3] = '\x04';
  p->NS2BSIndx[4] = '\x04';
  p->NS2BSIndx[5] = '\x04';
  p->NS2BSIndx[6] = '\x04';
  p->NS2BSIndx[7] = '\x04';
  p->NS2BSIndx[8] = '\x04';
  p->NS2BSIndx[9] = '\x04';
  p->NS2BSIndx[10] = '\x04';
  memset(p->NS2BSIndx + 0xb,6,0xf5);
  auVar1 = _DAT_0016a280;
  lVar4 = 0;
  auVar10 = _DAT_0016a270;
  do {
    if (SUB164(auVar10 ^ auVar1,4) == -0x80000000 && SUB164(auVar10 ^ auVar1,0) < -0x7ffffffd) {
      p->NS2Indx[lVar4] = (Byte)lVar4;
      p->NS2Indx[lVar4 + 1] = (Byte)lVar4 + '\x01';
    }
    lVar4 = lVar4 + 2;
    lVar11 = auVar10._8_8_;
    auVar10._0_8_ = auVar10._0_8_ + 2;
    auVar10._8_8_ = lVar11 + 2;
  } while (lVar4 != 4);
  iVar7 = 1;
  iVar8 = 3;
  lVar4 = 0;
  do {
    p->NS2Indx[lVar4 + 3] = (Byte)iVar8;
    iVar2 = iVar7 + -1;
    iVar7 = iVar2;
    if (iVar2 == 0) {
      iVar7 = iVar8 + -1;
    }
    iVar8 = (uint)(iVar2 == 0) + iVar8;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0xfd);
  p->HB2Flag[0x30] = '\0';
  p->HB2Flag[0x31] = '\0';
  p->HB2Flag[0x32] = '\0';
  p->HB2Flag[0x33] = '\0';
  p->HB2Flag[0x34] = '\0';
  p->HB2Flag[0x35] = '\0';
  p->HB2Flag[0x36] = '\0';
  p->HB2Flag[0x37] = '\0';
  p->HB2Flag[0x38] = '\0';
  p->HB2Flag[0x39] = '\0';
  p->HB2Flag[0x3a] = '\0';
  p->HB2Flag[0x3b] = '\0';
  p->HB2Flag[0x3c] = '\0';
  p->HB2Flag[0x3d] = '\0';
  p->HB2Flag[0x3e] = '\0';
  p->HB2Flag[0x3f] = '\0';
  p->HB2Flag[0x20] = '\0';
  p->HB2Flag[0x21] = '\0';
  p->HB2Flag[0x22] = '\0';
  p->HB2Flag[0x23] = '\0';
  p->HB2Flag[0x24] = '\0';
  p->HB2Flag[0x25] = '\0';
  p->HB2Flag[0x26] = '\0';
  p->HB2Flag[0x27] = '\0';
  p->HB2Flag[0x28] = '\0';
  p->HB2Flag[0x29] = '\0';
  p->HB2Flag[0x2a] = '\0';
  p->HB2Flag[0x2b] = '\0';
  p->HB2Flag[0x2c] = '\0';
  p->HB2Flag[0x2d] = '\0';
  p->HB2Flag[0x2e] = '\0';
  p->HB2Flag[0x2f] = '\0';
  p->HB2Flag[0x10] = '\0';
  p->HB2Flag[0x11] = '\0';
  p->HB2Flag[0x12] = '\0';
  p->HB2Flag[0x13] = '\0';
  p->HB2Flag[0x14] = '\0';
  p->HB2Flag[0x15] = '\0';
  p->HB2Flag[0x16] = '\0';
  p->HB2Flag[0x17] = '\0';
  p->HB2Flag[0x18] = '\0';
  p->HB2Flag[0x19] = '\0';
  p->HB2Flag[0x1a] = '\0';
  p->HB2Flag[0x1b] = '\0';
  p->HB2Flag[0x1c] = '\0';
  p->HB2Flag[0x1d] = '\0';
  p->HB2Flag[0x1e] = '\0';
  p->HB2Flag[0x1f] = '\0';
  p->HB2Flag[0] = '\0';
  p->HB2Flag[1] = '\0';
  p->HB2Flag[2] = '\0';
  p->HB2Flag[3] = '\0';
  p->HB2Flag[4] = '\0';
  p->HB2Flag[5] = '\0';
  p->HB2Flag[6] = '\0';
  p->HB2Flag[7] = '\0';
  p->HB2Flag[8] = '\0';
  p->HB2Flag[9] = '\0';
  p->HB2Flag[10] = '\0';
  p->HB2Flag[0xb] = '\0';
  p->HB2Flag[0xc] = '\0';
  p->HB2Flag[0xd] = '\0';
  p->HB2Flag[0xe] = '\0';
  p->HB2Flag[0xf] = '\0';
  memset(p->HB2Flag + 0x40,8,0xc0);
  return;
}

Assistant:

static void Ppmd7_Construct(CPpmd7 *p)
{
  unsigned i, k, m;

  p->Base = 0;

  for (i = 0, k = 0; i < PPMD_NUM_INDEXES; i++)
  {
    unsigned step = (i >= 12 ? 4 : (i >> 2) + 1);
    do { p->Units2Indx[k++] = (Byte)i; } while(--step);
    p->Indx2Units[i] = (Byte)k;
  }

  p->NS2BSIndx[0] = (0 << 1);
  p->NS2BSIndx[1] = (1 << 1);
  memset(p->NS2BSIndx + 2, (2 << 1), 9);
  memset(p->NS2BSIndx + 11, (3 << 1), 256 - 11);

  for (i = 0; i < 3; i++)
    p->NS2Indx[i] = (Byte)i;
  for (m = i, k = 1; i < 256; i++)
  {
    p->NS2Indx[i] = (Byte)m;
    if (--k == 0)
      k = (++m) - 2;
  }

  memset(p->HB2Flag, 0, 0x40);
  memset(p->HB2Flag + 0x40, 8, 0x100 - 0x40);
}